

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

LispPTR COM_getfileinfo(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  LispPTR LVar6;
  char *pcVar8;
  int *piVar9;
  size_t sVar10;
  passwd *ppVar11;
  char cVar12;
  DLword *pDVar13;
  size_t sVar14;
  long lVar15;
  char ver [16];
  stat sbuf;
  char name [255];
  char host [255];
  char file [4096];
  char lfname [4101];
  char dir [4096];
  char local_32e8 [16];
  stat local_32d8;
  char local_3248 [256];
  undefined4 local_3148;
  char local_3144;
  char local_3048 [4096];
  char local_2048 [4112];
  char local_1038 [4104];
  long lVar7;
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar2 = args[3];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  Lisp_errno = (int *)(Lisp_world + uVar2);
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2 + 5;
  }
  else {
    if ((char)Lisp_world[(ulong)uVar2 + 3] != 'C') {
      error("LispStringLength: Not a character array.\n");
      goto LAB_0011ea8e;
    }
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) + 3;
  }
  if (0x1005 < iVar4) {
    *Lisp_errno = 200;
    return 0;
  }
LAB_0011ea8e:
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
  iVar5 = 0x1000;
  if (iVar4 < 0x1000) {
    iVar5 = iVar4;
  }
  lVar7 = (long)iVar5;
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    if (iVar4 == 0) {
      pcVar8 = local_2048;
    }
    else {
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      pDVar13 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar2 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
      pcVar8 = local_2048;
      do {
        *pcVar8 = *(char *)((ulong)pDVar13 ^ 2);
        pcVar8 = pcVar8 + 1;
        pDVar13 = pDVar13 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    *pcVar8 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
    if (iVar4 != 0) {
      uVar3 = *(uint *)(Lisp_world + uVar2);
      uVar1 = Lisp_world[(ulong)uVar2 + 2];
      lVar15 = 0;
      do {
        local_2048[lVar15] =
             *(char *)((long)Lisp_world + lVar15 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^ 3
                      );
        lVar15 = lVar15 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar15);
    }
    local_2048[lVar7] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  separate_host(local_2048,(char *)&local_3148);
  if ((char)local_3148 != '\0') {
    pcVar8 = (char *)((long)&local_3148 + 1);
    cVar12 = (char)local_3148;
    do {
      if ((byte)(cVar12 + 0x9fU) < 0x1a) {
        pcVar8[-1] = cVar12 + -0x20;
      }
      cVar12 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar12 != '\0');
  }
  if (local_3148 == 0x4b5344) {
    unixpathname(local_2048,local_3048,1,0);
    iVar4 = unpack_filename(local_3048,local_1038,local_3248,local_32e8,1);
    if ((iVar4 == 0) || (iVar4 = true_name(local_1038), iVar4 != -1)) {
      return 0;
    }
    if (local_3248[0] == '\0') {
      strcpy(local_3048,local_1038);
    }
    else {
      iVar4 = get_version_array(local_1038,local_3248);
      if (iVar4 == 0) {
        return 0;
      }
      strcpy(local_3048,local_3248);
      if (local_32e8[0] != '\0') {
        sVar10 = strlen(local_3048);
        (local_3048 + sVar10)[0] = '.';
        (local_3048 + sVar10)[1] = '~';
        local_3048[sVar10 + 2] = '\0';
        strcat(local_3048,local_32e8);
        sVar10 = strlen(local_3048);
        (local_3048 + sVar10)[0] = '~';
        (local_3048 + sVar10)[1] = '\0';
      }
      iVar4 = get_old(local_1038,VA.files,local_3048,local_3248);
      if (iVar4 == 0) {
        return 0;
      }
    }
  }
  else {
    if (local_3144 != '\0' || local_3148 != 0x58494e55) {
      return 0;
    }
    unixpathname(local_2048,local_3048,0,0);
  }
  alarm(TIMEOUT_TIME);
  piVar9 = __errno_location();
LAB_0011ec9c:
  *piVar9 = 0;
  iVar4 = stat(local_3048,&local_32d8);
  if (iVar4 == -1) goto code_r0x0011ecb3;
  alarm(0);
  if (iVar4 != 0) goto LAB_0011ecd9;
  switch(args[1]) {
  case 0xe0001:
    uVar2 = args[2];
    local_32d8.st_mode = (__mode_t)local_32d8.st_size;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      local_32d8.st_mode = (__mode_t)local_32d8.st_size;
    }
    break;
  case 0xe0002:
    uVar2 = args[2];
    local_32d8.st_atim.tv_sec._0_4_ = (int)local_32d8.st_mtim.tv_sec;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      local_32d8.st_atim.tv_sec._0_4_ = (int)local_32d8.st_mtim.tv_sec;
    }
    goto LAB_0011efa2;
  case 0xe0003:
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
LAB_0011efa2:
    *(int *)(Lisp_world + uVar2) = (int)local_32d8.st_atim.tv_sec + 0x1c94b00;
    return 0x4c;
  default:
    return 0;
  case 0xe0005:
    alarm(TIMEOUT_TIME);
    goto LAB_0011efbe;
  case 0xe0006:
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    break;
  case 0xe0008:
    LVar6 = car(args[2]);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(__mode_t *)(Lisp_world + LVar6) = (__mode_t)local_32d8.st_size;
    LVar6 = cdr(args[2]);
    LVar6 = car(LVar6);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(int *)(Lisp_world + LVar6) = (int)local_32d8.st_mtim.tv_sec + 0x1c94b00;
    LVar6 = cdr(args[2]);
    LVar6 = cdr(LVar6);
    LVar6 = car(LVar6);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(int *)(Lisp_world + LVar6) = (int)local_32d8.st_atim.tv_sec + 0x1c94b00;
    LVar6 = cdr(args[2]);
    LVar6 = cdr(LVar6);
    LVar6 = cdr(LVar6);
    LVar6 = car(LVar6);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(__mode_t *)(Lisp_world + LVar6) = local_32d8.st_mode;
    alarm(TIMEOUT_TIME);
    goto LAB_0011ef5e;
  }
  *(__mode_t *)(Lisp_world + uVar2) = local_32d8.st_mode;
  return 0x4c;
code_r0x0011ecb3:
  if (*piVar9 != 4) {
    alarm(0);
LAB_0011ecd9:
    *Lisp_errno = *piVar9;
    return 0;
  }
  goto LAB_0011ec9c;
LAB_0011ef5e:
  *piVar9 = 0;
  ppVar11 = getpwuid(local_32d8.st_uid);
  if (ppVar11 == (passwd *)0x0) goto code_r0x0011ef76;
  alarm(0);
  LVar6 = cdr(args[2]);
  LVar6 = cdr(LVar6);
  LVar6 = cdr(LVar6);
  LVar6 = cdr(LVar6);
  LVar6 = car(LVar6);
  LVar6 = cdr(LVar6);
  if ((LVar6 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
  }
  pcVar8 = ppVar11->pw_name;
  sVar10 = strlen(pcVar8);
  pDVar13 = Lisp_world;
  if (sVar10 != 0) {
    uVar2 = *(uint *)(Lisp_world + LVar6);
    sVar14 = 0;
    do {
      *(char *)((long)pDVar13 + sVar14 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = pcVar8[sVar14];
      sVar14 = sVar14 + 1;
    } while (sVar10 != sVar14);
    goto LAB_0011f117;
  }
  goto LAB_0011f11f;
code_r0x0011ef76:
  if (*piVar9 != 4) goto LAB_0011efdc;
  goto LAB_0011ef5e;
  while (*piVar9 == 4) {
LAB_0011efbe:
    *piVar9 = 0;
    ppVar11 = getpwuid(local_32d8.st_uid);
    if (ppVar11 != (passwd *)0x0) {
      alarm(0);
      uVar2 = args[2];
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      pcVar8 = ppVar11->pw_name;
      sVar10 = strlen(pcVar8);
      pDVar13 = Lisp_world;
      if (sVar10 != 0) {
        uVar2 = *(uint *)(Lisp_world + uVar2);
        sVar14 = 0;
        do {
          *(char *)((long)pDVar13 + sVar14 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = pcVar8[sVar14];
          sVar14 = sVar14 + 1;
        } while (sVar10 != sVar14);
LAB_0011f117:
        if (0xffff < sVar10) {
          error("Not Smallp data");
          return 0xe0000;
        }
      }
LAB_0011f11f:
      return (uint)sVar10 | 0xe0000;
    }
  }
LAB_0011efdc:
  alarm(0);
  return 0xe0000;
}

Assistant:

LispPTR COM_getfileinfo(LispPTR *args)
{
  int dskp, rval;
  size_t len;
  unsigned *bufp;
#ifndef DOS
  struct passwd *pwd;
#endif
  char *base;
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  struct stat sbuf;
  LispPTR laddr;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif

  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else  /* DOS */
  unixpathname(lfname, file, dskp, 0);
#endif /* DOS */

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  The Lisp code for GETFILEINFO always
   * recognizes a file with old mode.  Thus, we recognize it again using
   * get_old routine.  It will let us know the "real accessible" name of
   * the file.
   */
  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (strcmp(name, "") == 0) {
      /*
       * The directory is specified.
       */
      strcpy(file, dir);
    } else {
      if (get_version_array(dir, name) == 0) return (NIL);
      ConcNameAndVersion(name, ver, file);
      if (get_old(dir, VA.files, file, name) == 0) return (NIL);
    }
  }

  TIMEOUT(rval = stat(file, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  switch (args[1]) {
    case LENGTH:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)sbuf.st_size;
      return (ATOM_T);

    case WDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_mtime);
      return (ATOM_T);

    case RDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_atime);
      return (ATOM_T);

    case PROTECTION:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = sbuf.st_mode;
      return (ATOM_T);

    case AUTHOR: {
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) {
        /*
         * Returns Lisp 0.  Lisp code handles this case as author
         * unknown.  The returned value from Lisp GETFILEINFO
         * function would be "".
         */
        return (SMALLP_ZERO);
      }
      STRING_BASE(args[2], base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    case ALL: {
      /*
       * The format of the buffer which has been allocated by Lisp
       * is as follows.
       * 	((LENGTH	.	fixp)
       *	 (WDATE		.	fixp)
       *	 (RDATE		.	fixp)
       *	 (PROTECTION	.	fixp)
       *	 (AUTHOR	.	string))
       */
      laddr = cdr(car(args[2]));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_size;

      laddr = cdr(car(cdr(args[2])));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_mtime);

      laddr = cdr(car(cdr(cdr(args[2]))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_atime);

      laddr = cdr(car(cdr(cdr(cdr(args[2])))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_mode;
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) { return (SMALLP_ZERO); }
      laddr = cdr(car(cdr(cdr(cdr(cdr(args[2]))))));
      STRING_BASE(laddr, base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP	 */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    default: return (NIL);
  }
}